

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O2

int * Expr_Div(int *dest,int *xnode,FXlatExprState *state)

{
  int *piVar1;
  int op2;
  int op1;
  int local_30;
  int local_2c;
  
  piVar1 = (*XlatExprEval[xnode[-1]])(&local_30,xnode + -1,state);
  piVar1 = (*XlatExprEval[*piVar1])(&local_2c,piVar1,state);
  Div0Check(&local_2c,&local_30,state);
  *dest = local_2c / local_30;
  return piVar1;
}

Assistant:

static const int *Expr_Div(int *dest, const int *xnode, FXlatExprState *state)
{
	int op1, op2;

	xnode = XlatExprEval[xnode[-1]](&op2, xnode-1, state);
	xnode = XlatExprEval[xnode[0]](&op1, xnode, state);
	Div0Check(op1, op2, state);
	*dest = op1 / op2;
	return xnode;
}